

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

void google::protobuf::internal::WriteVarint(uint64 val,string *s)

{
  char in_SIL;
  ulong in_RDI;
  uint8 c;
  undefined8 local_8;
  
  for (local_8 = in_RDI; 0x7f < local_8; local_8 = local_8 >> 7) {
    std::__cxx11::string::push_back(in_SIL);
  }
  std::__cxx11::string::push_back(in_SIL);
  return;
}

Assistant:

inline void WriteVarint(uint64 val, std::string* s) {
  while (val >= 128) {
    uint8 c = val | 0x80;
    s->push_back(c);
    val >>= 7;
  }
  s->push_back(val);
}